

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O0

void cjson_create_object_reference_should_create_an_object_reference(void)

{
  cJSON_bool cVar1;
  cJSON *item;
  cJSON *item_00;
  cJSON *item_01;
  long in_FS_OFFSET;
  cJSON *number;
  cJSON *number_object;
  cJSON *number_reference;
  long lStack_10;
  char key [7];
  
  lStack_10 = *(long *)(in_FS_OFFSET + 0x28);
  item = cJSON_CreateObject();
  item_00 = cJSON_CreateNumber(42.0);
  number_reference._1_4_ = 0x626d756e;
  number_reference._5_2_ = 0x7265;
  number_reference._7_1_ = 0;
  cVar1 = cJSON_IsNumber(item_00);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x251);
  }
  cVar1 = cJSON_IsObject(item);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x252);
  }
  cJSON_AddItemToObjectCS(item,(char *)((long)&number_reference + 1),item_00);
  item_01 = cJSON_CreateObjectReference(item_00);
  if (item_01->child != item_00) {
    UnityFail(" Expected TRUE Was FALSE",0x256);
  }
  UnityAssertEqualNumber(0x140,(long)item_01->type,(char *)0x0,599,UNITY_DISPLAY_STYLE_INT);
  cJSON_Delete(item);
  cJSON_Delete(item_01);
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void cjson_create_object_reference_should_create_an_object_reference(void)
{
    cJSON *number_reference = NULL;
    cJSON *number_object = cJSON_CreateObject();
    cJSON *number = cJSON_CreateNumber(42);
    const char key[] = "number";

    TEST_ASSERT_TRUE(cJSON_IsNumber(number));
    TEST_ASSERT_TRUE(cJSON_IsObject(number_object));
    cJSON_AddItemToObjectCS(number_object, key, number);

    number_reference = cJSON_CreateObjectReference(number);
    TEST_ASSERT_TRUE(number_reference->child == number);
    TEST_ASSERT_EQUAL_INT(cJSON_Object | cJSON_IsReference, number_reference->type);

    cJSON_Delete(number_object);
    cJSON_Delete(number_reference);
}